

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identical-sequences-recognizer.cpp
# Opt level: O3

void __thiscall
mahjong::IdenticalSequencesRecognizer::check(IdenticalSequencesRecognizer *this,Meld *meld)

{
  pointer ppVar1;
  bool bVar2;
  pointer this_00;
  pair<mahjong::Meld,_int> local_48;
  
  bVar2 = Meld::isTripletOrQuad(meld);
  if (!bVar2) {
    ppVar1 = (this->identity_infos).
             super__Vector_base<std::pair<mahjong::Meld,_int>,_std::allocator<std::pair<mahjong::Meld,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (this->identity_infos).
                   super__Vector_base<std::pair<mahjong::Meld,_int>,_std::allocator<std::pair<mahjong::Meld,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != ppVar1;
        this_00 = this_00 + 1) {
      bVar2 = Meld::isSame(&this_00->first,meld);
      if (bVar2) {
        this_00->second = this_00->second + 1;
        return;
      }
    }
    std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::vector
              ((vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> *)&local_48,&meld->tiles);
    local_48.first.is_open = meld->is_open;
    local_48.second = 1;
    std::vector<std::pair<mahjong::Meld,int>,std::allocator<std::pair<mahjong::Meld,int>>>::
    emplace_back<std::pair<mahjong::Meld,int>>
              ((vector<std::pair<mahjong::Meld,int>,std::allocator<std::pair<mahjong::Meld,int>>> *)
               &this->identity_infos,&local_48);
    if (local_48.first.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.first.tiles.
                      super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.first.tiles.
                            super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.first.tiles.
                            super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void IdenticalSequencesRecognizer::check(const Meld& meld)
{
	if (meld.isTripletOrQuad()) return;

	for (auto& it : identity_infos)
	{
		if (it.first.isSame(meld))
		{
			it.second++;
			return;
		}
	}

	identity_infos.push_back({ meld, 1 });
}